

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelExtractor.cpp
# Opt level: O0

void __thiscall hiberlite::ModelExtractor::ModelExtractor(ModelExtractor *this)

{
  ModelExtractor *this_local;
  
  AVisitor<hiberlite::ExtractModel>::AVisitor
            (&this->super_AVisitor<hiberlite::ExtractModel>,&this->actor,3);
  ExtractModel::ExtractModel(&this->actor);
  return;
}

Assistant:

ModelExtractor::ModelExtractor() : AVisitor<ExtractModel>(&actor, MODEL)
{}